

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reportjson.cpp
# Opt level: O1

void __thiscall trun::ResultsReportJSON::PrintAssertArray(ResultsReportJSON *this,Ref *result)

{
  element_type *peVar1;
  AssertErrorItem *pAVar2;
  char *format;
  AssertErrorItem *ass;
  AssertErrorItem *aerr;
  
  ResultsReportPinterBase::WriteLine(&this->super_ResultsReportPinterBase,"\"Asserts\" : [");
  ResultsReportPinterBase::PushIndent(&this->super_ResultsReportPinterBase);
  peVar1 = (result->super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  pAVar2 = *(pointer *)
            ((long)&(peVar1->assertError).assertErrors.
                    super__Vector_base<trun::AssertError::AssertErrorItem,_std::allocator<trun::AssertError::AssertErrorItem>_>
                    ._M_impl.super__Vector_impl_data + 8);
  for (aerr = (peVar1->assertError).assertErrors.
              super__Vector_base<trun::AssertError::AssertErrorItem,_std::allocator<trun::AssertError::AssertErrorItem>_>
              ._M_impl.super__Vector_impl_data._M_start; aerr != pAVar2; aerr = aerr + 1) {
    ResultsReportPinterBase::WriteLine(&this->super_ResultsReportPinterBase,"{");
    PrintAssert(this,aerr);
    format = "},";
    if (aerr == *(pointer *)
                 ((long)&(((result->super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>
                           )._M_ptr)->assertError).assertErrors.
                         super__Vector_base<trun::AssertError::AssertErrorItem,_std::allocator<trun::AssertError::AssertErrorItem>_>
                         ._M_impl.super__Vector_impl_data + 8) + -1) {
      format = "}";
    }
    ResultsReportPinterBase::WriteLine(&this->super_ResultsReportPinterBase,format);
  }
  ResultsReportPinterBase::PopIndent(&this->super_ResultsReportPinterBase);
  ResultsReportPinterBase::WriteLine(&this->super_ResultsReportPinterBase,"]");
  return;
}

Assistant:

void ResultsReportJSON::PrintAssertArray(const TestResult::Ref result) {
    WriteLine(R"("Asserts" : [)");
    PushIndent();
    for(const auto &ass : result->AssertError().Errors()) {
        WriteLine("{");
        PrintAssert(ass);
        // This must be the worst in a long while...
        if (&ass != &result->AssertError().Errors().back()) {
            WriteLine("},");
        } else {
            WriteLine("}");
        }
    }
    PopIndent();
    WriteLine("]");
}